

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp.c
# Opt level: O0

ssize_t rtp_pkt_send(rtp_pkt_t *pkt,int fd)

{
  ssize_t sVar1;
  uint local_18;
  uint len;
  int fd_local;
  rtp_pkt_t *pkt_local;
  
  if (pkt != (rtp_pkt_t *)0x0) {
    rtp_pkt_pack(pkt);
    pkt->b = (rtp_bits_t)((uint)pkt->b & 0xffff | (((uint)pkt->b >> 0x10) + 1) * 0x10000);
    local_18 = (int)pkt->length + pkt->hlen + ((uint)pkt->b >> 4 & 0xf) * 4;
    if (((uint)pkt->b >> 2 & 1) != 0) {
      local_18 = pkt->plen + 1 + local_18;
    }
    sVar1 = send(fd,pkt->data,(ulong)local_18,0);
    return sVar1;
  }
  __assert_fail("pkt != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp.c",
                0x7f,"ssize_t rtp_pkt_send(rtp_pkt_t *, int)");
}

Assistant:

ssize_t rtp_pkt_send(rtp_pkt_t *pkt, int fd) {
  assert(pkt != NULL);
  
  rtp_pkt_pack(pkt);
  
  /*M
    Increment sequence number.
  **/
  pkt->b.seq++;

  unsigned int len = pkt->length + pkt->hlen + pkt->b.cc * RTP_CSRC_SIZE;

  /*M
    If padding is 1, then we have signed the packet.
  **/
  if (pkt->b.p)
    len += pkt->plen + 1;

  /*M
    Send pack on \verb|fd|.
  **/
  return send(fd, pkt->data, len, 0);
}